

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7447916::GeneratorStateHelper::~GeneratorStateHelper(GeneratorStateHelper *this)

{
  JavascriptGenerator *this_00;
  uint uVar1;
  uint uVar2;
  ByteBlock *this_01;
  byte in_SIL;
  InterpreterStackFrame *frame;
  
  this_00 = this[2].generator;
  if (this_00 != (JavascriptGenerator *)0x0 && (in_SIL & 1) == 0) {
    uVar1 = Js::ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this_00);
    this_01 = Js::FunctionBody::GetByteCode(*(FunctionBody **)&this_00[1].state);
    uVar2 = Js::ByteBlock::GetLength(this_01);
    if (uVar1 != uVar2 - 1) {
      *(undefined4 *)&this[2].didThrow = 1;
      return;
    }
  }
  *(undefined4 *)&this[2].didThrow = 3;
  this[2].generator = (JavascriptGenerator *)0x0;
  *(undefined8 *)&this[3].didThrow = 0;
  this[4].generator = (JavascriptGenerator *)0x0;
  return;
}

Assistant:

~GeneratorStateHelper()
        {
            generator->SetState(IsDone() ? GeneratorState::Completed : GeneratorState::Suspended);
        }